

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningParameter.cpp
# Opt level: O0

bool __thiscall
DIS::DeadReckoningParameter::operator==(DeadReckoningParameter *this,DeadReckoningParameter *rhs)

{
  bool bVar1;
  byte local_1a;
  bool local_19;
  uchar idx;
  bool ivarsEqual;
  DeadReckoningParameter *rhs_local;
  DeadReckoningParameter *this_local;
  
  local_19 = this->_deadReckoningAlgorithm == rhs->_deadReckoningAlgorithm;
  for (local_1a = 0; local_1a < 0xf; local_1a = local_1a + 1) {
    if (this->_otherParameters[local_1a] != rhs->_otherParameters[local_1a]) {
      local_19 = false;
    }
  }
  bVar1 = Vector3Float::operator==(&this->_entityLinearAcceleration,&rhs->_entityLinearAcceleration)
  ;
  if (!bVar1) {
    local_19 = false;
  }
  bVar1 = Vector3Float::operator==(&this->_entityAngularVelocity,&rhs->_entityAngularVelocity);
  if (!bVar1) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool DeadReckoningParameter::operator ==(const DeadReckoningParameter& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_deadReckoningAlgorithm == rhs._deadReckoningAlgorithm) ) ivarsEqual = false;

     for(unsigned char idx = 0; idx < 15; idx++)
     {
          if(!(_otherParameters[idx] == rhs._otherParameters[idx]) ) ivarsEqual = false;
     }

     if( ! (_entityLinearAcceleration == rhs._entityLinearAcceleration) ) ivarsEqual = false;
     if( ! (_entityAngularVelocity == rhs._entityAngularVelocity) ) ivarsEqual = false;

    return ivarsEqual;
 }